

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QString,_QFileInfo>_>::clear(QList<std::pair<QString,_QFileInfo>_> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<std::pair<QString,_QFileInfo>_> *this_00;
  __off_t __length;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<std::pair<QString,_QFileInfo>_> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::allocatedCapacity(in_RDI);
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<std::pair<QString,_QFileInfo>_> *)
                QArrayDataPointer<std::pair<QString,_QFileInfo>_>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }